

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O1

_Bool al_attach_shader_source_file(ALLEGRO_SHADER *shader,ALLEGRO_SHADER_TYPE type,char *filename)

{
  _Bool _Var1;
  ALLEGRO_FILE *f;
  ALLEGRO_USTR *pAVar2;
  size_t size;
  ALLEGRO_USTR *us2;
  char *pcVar3;
  ALLEGRO_USTR_INFO info;
  char buf [512];
  ALLEGRO_USTR_INFO AStack_248;
  char local_238 [520];
  
  f = al_fopen(filename,"r");
  if (f == (ALLEGRO_FILE *)0x0) {
    _Var1 = _al_trace_prefix("shader",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                             ,0x65,"al_attach_shader_source_file");
    if (_Var1) {
      _al_trace_suffix("Failed to open %s\n",filename);
    }
    al_ustr_free(shader->log);
    _Var1 = false;
    pAVar2 = al_ustr_newf("Failed to open %s",filename);
    shader->log = pAVar2;
  }
  else {
    pAVar2 = al_ustr_new("");
    size = al_fread(f,local_238,0x200);
    if (size != 0) {
      do {
        us2 = al_ref_buffer(&AStack_248,local_238,size);
        al_ustr_append(pAVar2,us2);
        size = al_fread(f,local_238,0x200);
      } while (size != 0);
    }
    al_fclose(f);
    pcVar3 = al_cstr(pAVar2);
    _Var1 = (*shader->vt->attach_shader_source)(shader,type,pcVar3);
    al_ustr_free(pAVar2);
  }
  return _Var1;
}

Assistant:

bool al_attach_shader_source_file(ALLEGRO_SHADER *shader,
   ALLEGRO_SHADER_TYPE type, const char *filename)
{
   ALLEGRO_FILE *fp;
   ALLEGRO_USTR *str;
   bool ret;

   fp = al_fopen(filename, "r");
   if (!fp) {
      ALLEGRO_WARN("Failed to open %s\n", filename);
      al_ustr_free(shader->log);
      shader->log = al_ustr_newf("Failed to open %s", filename);
      return false;
   }
   str = al_ustr_new("");
   for (;;) {
      char buf[512];
      size_t n;
      ALLEGRO_USTR_INFO info;

      n = al_fread(fp, buf, sizeof(buf));
      if (n <= 0)
         break;
      al_ustr_append(str, al_ref_buffer(&info, buf, n));
   }
   al_fclose(fp);
   ret = al_attach_shader_source(shader, type, al_cstr(str));
   al_ustr_free(str);
   return ret;
}